

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O1

BasicBlock * __thiscall
spvtools::opt::MergeReturnPass::CreateContinueTarget(MergeReturnPass *this,uint32_t header_label_id)

{
  IRContext *pIVar1;
  Function *pFVar2;
  pointer puVar3;
  pointer puVar4;
  BasicBlock *blk;
  uint32_t res_id;
  Instruction *pIVar5;
  mapped_type *ppBVar6;
  pointer *__ptr;
  const_iterator __position;
  long lVar7;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> block;
  InstructionBuilder builder;
  BasicBlock *local_68;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_60;
  InstructionBuilder local_58;
  
  pIVar5 = (Instruction *)operator_new(0x70);
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  res_id = Pass::TakeNextId((Pass *)this);
  local_58.insert_before_.super_iterator.node_ = (iterator)(Instruction *)0x0;
  local_58.context_ = (IRContext *)0x0;
  local_58.parent_ = (BasicBlock *)0x0;
  Instruction::Instruction(pIVar5,pIVar1,OpLabel,0,res_id,(OperandList *)&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_58);
  local_60._M_head_impl = (BasicBlock *)operator_new(0x88);
  (local_60._M_head_impl)->function_ = (Function *)0x0;
  ((local_60._M_head_impl)->label_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar5;
  pIVar5 = &((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_;
  ((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
  ((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
  ((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_003e9ae0;
  ((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  unique_id_ = 0;
  ((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  context_ = (IRContext *)0x0;
  *(undefined8 *)
   ((long)&((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.context_ + 6) = 0;
  ((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  ((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_line_insts_.
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  ((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_scope_.lexical_scope_ = 0;
  ((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_scope_.inlined_at_ = 0;
  ((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar5;
  ((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar5;
  ((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
  ((local_60._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
  _vptr_IntrusiveList = (_func_int **)&PTR__InstructionList_003e9b78;
  pFVar2 = this->function_;
  puVar3 = (pFVar2->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (pFVar2->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = local_60._M_head_impl;
  if (puVar4 == puVar3) {
    __assert_fail("pos != function_->begin()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                  ,0x326,
                  "BasicBlock *spvtools::opt::MergeReturnPass::CreateContinueTarget(uint32_t)");
  }
  __position._M_current = puVar4 + -1;
  lVar7 = (long)__position._M_current - (long)puVar3;
  if (lVar7 != 0) {
    if (((__position._M_current)->_M_t).
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl ==
        this->final_return_block_) {
      local_68 = (BasicBlock *)0x0;
      std::
      vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ::_M_insert_rval(&pFVar2->blocks_,__position,(value_type *)&local_60);
      blk = *(BasicBlock **)
             ((long)(pFVar2->blocks_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar7);
      if (local_60._M_head_impl != (BasicBlock *)0x0) {
        std::default_delete<spvtools::opt::BasicBlock>::operator()
                  ((default_delete<spvtools::opt::BasicBlock> *)&local_60,local_60._M_head_impl);
      }
      local_60._M_head_impl = (BasicBlock *)0x0;
      blk->function_ = this->function_;
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::AnalyzeInstDefUse
                  ((pIVar1->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,
                   (blk->label_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                   .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
      }
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      local_58.context_ =
           (IRContext *)
           (blk->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if ((pIVar1->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
        ppBVar6 = std::__detail::
                  _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pIVar1->instr_to_block_,(key_type *)&local_58);
        *ppBVar6 = blk;
      }
      local_58.context_ = (this->super_MemPass).super_Pass.context_;
      local_58.insert_before_.super_iterator.node_ =
           (iterator)&(blk->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
      local_58.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
      local_58.parent_ = blk;
      InstructionBuilder::AddBranch(&local_58,header_label_id);
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisCFG) != kAnalysisNone) {
        CFG::RegisterBlock((pIVar1->cfg_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                           .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,blk);
      }
      if (local_68 != (BasicBlock *)0x0) {
        std::default_delete<spvtools::opt::BasicBlock>::operator()
                  ((default_delete<spvtools::opt::BasicBlock> *)&local_68,local_68);
      }
      return blk;
    }
    __assert_fail("&*pos == final_return_block_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                  ,0x329,
                  "BasicBlock *spvtools::opt::MergeReturnPass::CreateContinueTarget(uint32_t)");
  }
  __assert_fail("pos != function_->begin()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                ,0x328,"BasicBlock *spvtools::opt::MergeReturnPass::CreateContinueTarget(uint32_t)")
  ;
}

Assistant:

BasicBlock* MergeReturnPass::CreateContinueTarget(uint32_t header_label_id) {
  std::unique_ptr<Instruction> label(
      new Instruction(context(), spv::Op::OpLabel, 0u, TakeNextId(), {}));

  // Create the new basic block
  std::unique_ptr<BasicBlock> block(new BasicBlock(std::move(label)));

  // Insert the new block just before the return block
  auto pos = function_->end();
  assert(pos != function_->begin());
  pos--;
  assert(pos != function_->begin());
  assert(&*pos == final_return_block_);
  auto new_block = &*pos.InsertBefore(std::move(block));
  new_block->SetParent(function_);

  context()->AnalyzeDefUse(new_block->GetLabelInst());
  context()->set_instr_block(new_block->GetLabelInst(), new_block);

  InstructionBuilder builder(
      context(), new_block,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  builder.AddBranch(header_label_id);

  if (context()->AreAnalysesValid(IRContext::kAnalysisCFG)) {
    cfg()->RegisterBlock(new_block);
  }

  return new_block;
}